

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

void leb_DecodeNodeAttributeArray(leb_Node node,int attributeArraySize,float (*attributeArray) [3])

{
  float (*pafVar1) [3];
  ulong uVar2;
  long lVar3;
  uint uVar4;
  float dp;
  float fVar5;
  float attributeVector [3];
  undefined8 local_68;
  float local_60;
  float local_58 [12];
  
  if (0 < attributeArraySize) {
    local_58[0] = 1.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[4] = 1.0;
    local_58[5] = 0.0;
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[8] = 1.0;
    if (0 < node.depth) {
      uVar4 = node.depth + 1;
      do {
        leb__SplittingMatrix
                  ((float (*) [3])local_58,(uint)((node.id >> (uVar4 - 2 & 0x1f) & 1) != 0));
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    uVar2 = 0;
    do {
      pafVar1 = attributeArray + uVar2;
      local_60 = (*pafVar1)[2];
      local_68 = *(undefined8 *)*pafVar1;
      fVar5 = 0.0;
      lVar3 = 0;
      do {
        fVar5 = fVar5 + local_58[lVar3] * *(float *)((long)&local_68 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      (*pafVar1)[0] = fVar5;
      fVar5 = 0.0;
      lVar3 = 0;
      do {
        fVar5 = fVar5 + local_58[lVar3 + 3] * *(float *)((long)&local_68 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      (*pafVar1)[1] = fVar5;
      fVar5 = 0.0;
      lVar3 = 0;
      do {
        fVar5 = fVar5 + local_58[lVar3 + 6] * *(float *)((long)&local_68 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      (*pafVar1)[2] = fVar5;
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)attributeArraySize);
    return;
  }
  __assert_fail("attributeArraySize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x4c4,"void leb_DecodeNodeAttributeArray(const leb_Node, int, float (*)[3])");
}

Assistant:

LEBDEF void
leb_DecodeNodeAttributeArray(
    const leb_Node node,
    int attributeArraySize,
    float attributeArray[][3]
) {
    LEB_ASSERT(attributeArraySize > 0);

    lebMatrix3x3 m;
    float attributeVector[3];

    leb__DecodeTransformationMatrix(node, m);

    for (int i = 0; i < attributeArraySize; ++i) {
        memcpy(attributeVector, attributeArray[i], sizeof(attributeVector));
        attributeArray[i][0] = leb__DotProduct(3, m[0], attributeVector);
        attributeArray[i][1] = leb__DotProduct(3, m[1], attributeVector);
        attributeArray[i][2] = leb__DotProduct(3, m[2], attributeVector);
    }
}